

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_preprocessing_for_filter_gain.cc
# Opt level: O1

bool __thiscall
sptk::InputSourcePreprocessingForFilterGain::Get
          (InputSourcePreprocessingForFilterGain *this,
          vector<double,_std::allocator<double>_> *buffer)

{
  double *pdVar1;
  int iVar2;
  double *pdVar3;
  double dVar4;
  
  if (buffer == (vector<double,_std::allocator<double>_> *)0x0) {
    return false;
  }
  if ((this->is_valid_ == true) &&
     (iVar2 = (*this->source_->_vptr_InputSourceInterface[4])(), (char)iVar2 != '\0')) {
    switch(this->gain_type_) {
    case kLinear:
      break;
    case kLog:
      dVar4 = exp(**(double **)buffer);
      **(double **)buffer = dVar4;
      break;
    case kInverse:
      dVar4 = **(double **)buffer;
      if ((dVar4 == 0.0) && (!NAN(dVar4))) {
        return false;
      }
      **(double **)buffer = 1.0 / dVar4;
      break;
    case kUnity:
      **(undefined8 **)buffer = 0x3ff0000000000000;
      break;
    case kUnityForAllZeroFilter:
      pdVar3 = *(double **)buffer;
      dVar4 = *pdVar3;
      if ((dVar4 == 0.0) && (!NAN(dVar4))) {
        return false;
      }
      pdVar1 = *(double **)(buffer + 8);
      if (pdVar3 != pdVar1) {
        do {
          *pdVar3 = *pdVar3 * (1.0 / dVar4);
          pdVar3 = pdVar3 + 1;
        } while (pdVar3 != pdVar1);
      }
      break;
    default:
      goto LAB_00105cfa;
    }
    return true;
  }
LAB_00105cfa:
  return false;
}

Assistant:

bool InputSourcePreprocessingForFilterGain::Get(std::vector<double>* buffer) {
  if (NULL == buffer || !is_valid_) {
    return false;
  }

  if (!source_->Get(buffer)) {
    return false;
  }

  switch (gain_type_) {
    case kLinear: {
      // nothing to do
      break;
    }
    case kLog: {
      (*buffer)[0] = std::exp((*buffer)[0]);
      break;
    }
    case kInverse: {
      if (0.0 == (*buffer)[0]) return false;
      (*buffer)[0] = 1.0 / (*buffer)[0];
      break;
    }
    case kUnity: {
      (*buffer)[0] = 1.0;
      break;
    }
    case kUnityForAllZeroFilter: {
      if (0.0 == (*buffer)[0]) return false;
      const double inverse_of_b0(1.0 / (*buffer)[0]);
      std::transform(buffer->begin(), buffer->end(), buffer->begin(),
                     [inverse_of_b0](double x) { return x * inverse_of_b0; });
      break;
    }
    default: {
      return false;
    }
  }

  return true;
}